

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O2

void __thiscall
adios2::core::Operator::Operator
          (Operator *this,string *typeString,OperatorType typeEnum,string *category,
          Params *parameters)

{
  this->_vptr_Operator = (_func_int **)&PTR__Operator_0081a620;
  std::__cxx11::string::string((string *)&this->m_TypeString,(string *)typeString);
  this->m_TypeEnum = typeEnum;
  std::__cxx11::string::string((string *)&this->m_Category,(string *)category);
  helper::LowerCaseParams(&this->m_Parameters,parameters);
  (this->m_AccuracyRequested).error = 0.0;
  (this->m_AccuracyRequested).norm = 0.0;
  (this->m_AccuracyRequested).relative = false;
  (this->m_AccuracyProvided).error = 0.0;
  (this->m_AccuracyProvided).norm = 0.0;
  (this->m_AccuracyProvided).relative = false;
  return;
}

Assistant:

Operator::Operator(const std::string &typeString, const OperatorType typeEnum,
                   const std::string &category, const Params &parameters)
: m_TypeString(typeString), m_TypeEnum(typeEnum), m_Category(category),
  m_Parameters(helper::LowerCaseParams(parameters))
{
}